

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  Reader vatId;
  CapTableBuilder *pCVar1;
  Client CVar2;
  Builder hostId;
  MallocMessageBuilder refMessage;
  Builder local_1b0;
  PointerBuilder local_198;
  StructBuilder local_178;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x80,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1b0,&local_120.super_MessageBuilder);
  local_198.pointer = local_1b0.builder.pointer;
  local_198.segment = local_1b0.builder.segment;
  local_198.capTable = local_1b0.builder.capTable;
  PointerBuilder::initStruct(&local_178,&local_198,(StructSize)0x10001);
  local_198.segment = local_178.segment;
  local_198.capTable = local_178.capTable;
  local_198.pointer = local_178.pointers;
  PointerBuilder::setBlob<capnp::Text>(&local_198,(Reader)to.content);
  *(byte *)local_178.data = *local_178.data & 0xfe | unique;
  StructBuilder::asReader(&local_178);
  vatId._reader.capTable = (CapTableReader *)uStack_148;
  vatId._reader.segment = (SegmentReader *)local_150;
  vatId._reader.data = (void *)local_140;
  vatId._reader.pointers = (WirePointer *)uStack_138;
  vatId._reader.dataSize = (undefined4)local_130;
  vatId._reader.pointerCount = local_130._4_2_;
  vatId._reader._38_2_ = local_130._6_2_;
  vatId._reader._40_8_ = uStack_128;
  CVar2 = RpcSystemBase::baseBootstrap((RpcSystemBase *)&local_1b0,vatId);
  (*((local_1b0.builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_198,local_1b0.builder.capTable,CVar2.hook.ptr);
  pCVar1 = local_1b0.builder.capTable;
  *(SegmentBuilder **)&__return_storage_ptr__->field_0x8 = local_198.segment;
  *(CapTableBuilder **)&__return_storage_ptr__->field_0x10 = local_198.capTable;
  local_198.capTable = (CapTableBuilder *)0x0;
  *(pointer_____offset_0x10___ **)__return_storage_ptr__ =
       &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if (local_1b0.builder.capTable != (CapTableBuilder *)0x0) {
    local_1b0.builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1b0.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_1b0.builder.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }